

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O0

void __thiscall BamTools::RuleParser::~RuleParser(RuleParser *this)

{
  string *in_RDI;
  
  std::
  stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
  ::~stack((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
            *)0x21151f);
  std::
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~queue((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x21152d);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~RuleParser() {}